

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O2

void __thiscall
unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::push_leaf
          (iterator *this,node_ptr aleaf)

{
  iter_result<unodb::detail::node_header> local_20;
  
  local_20.key_byte = 0xff;
  local_20.child_index = 0xff;
  local_20.prefix.u64 = 0;
  local_20.node.tagged_ptr = aleaf.tagged_ptr;
  std::
  deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
  ::emplace_back<unodb::detail::iter_result<unodb::detail::node_header>>
            ((deque<unodb::detail::iter_result<unodb::detail::node_header>,std::allocator<unodb::detail::iter_result<unodb::detail::node_header>>>
              *)&this->stack_,&local_20);
  return;
}

Assistant:

void push_leaf(detail::node_ptr aleaf) {
      // Mock up a stack entry for the leaf.
      stack_.push({
          aleaf,
          static_cast<std::byte>(0xFFU),     // ignored for leaf
          static_cast<std::uint8_t>(0xFFU),  // ignored for leaf
          detail::key_prefix_snapshot(0)     // ignored for leaf
      });
      // No change in the key_buffer.
    }